

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

Node * __thiscall State::SpellcheckNode(State *this,string *path)

{
  int iVar1;
  __node_base *p_Var2;
  int iVar3;
  Node *local_48;
  StringPiece local_40;
  
  p_Var2 = &(this->paths_)._M_h._M_before_begin;
  local_48 = (Node *)0x0;
  iVar3 = 4;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    local_40.str_ = (path->_M_dataplus)._M_p;
    local_40.len_ = path->_M_string_length;
    iVar1 = EditDistance((StringPiece *)(p_Var2 + 1),&local_40,true,3);
    if ((iVar1 < iVar3) && ((Node *)p_Var2[3]._M_nxt != (Node *)0x0)) {
      local_48 = (Node *)p_Var2[3]._M_nxt;
      iVar3 = iVar1;
    }
  }
  return local_48;
}

Assistant:

Node* State::SpellcheckNode(const string& path) {
  const bool kAllowReplacements = true;
  const int kMaxValidEditDistance = 3;

  int min_distance = kMaxValidEditDistance + 1;
  Node* result = NULL;
  for (Paths::iterator i = paths_.begin(); i != paths_.end(); ++i) {
    int distance = EditDistance(
        i->first, path, kAllowReplacements, kMaxValidEditDistance);
    if (distance < min_distance && i->second) {
      min_distance = distance;
      result = i->second;
    }
  }
  return result;
}